

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O0

void __thiscall brown::Tile::drawhlin(Tile *this,int x0,int x1,int y,uint32_t col)

{
  int iVar1;
  uintptr_t uVar2;
  int local_40;
  int local_3c;
  uint32_t *lptr;
  int x;
  uint32_t col_local;
  int y_local;
  int x1_local;
  int x0_local;
  Tile *this_local;
  
  if ((uint)y < (uint)this->y) {
    local_3c = x0;
    if (x0 < 1) {
      local_3c = 0;
    }
    local_40 = x1;
    if (this->x <= x1) {
      local_40 = this->x;
    }
    if (local_3c < local_40) {
      iVar1 = this->p;
      uVar2 = this->f;
      for (lptr._4_4_ = local_3c; lptr._4_4_ < local_40; lptr._4_4_ = lptr._4_4_ + 1) {
        *(uint32_t *)((long)(iVar1 * y) + uVar2 + (long)lptr._4_4_ * 4) = col;
      }
    }
  }
  return;
}

Assistant:

void Tile::drawhlin (int x0, int x1, int y, std::uint32_t col)
{
    int x;
    std::uint32_t *lptr;

    if ((unsigned)y >= (unsigned)this->y) return;
    x0 = max(x0,0); x1 = min(x1,this->x); if (x0 >= x1) return;
    lptr = (std::uint32_t *)(this->p*y + this->f);
    for(x=x0;x<x1;x++) lptr[x] = col;
}